

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::api::json::
ExecuteDirectApi<cfd::api::json::ElementsDecodeRawTransactionRequest,cfd::api::json::ElementsDecodeRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
          *function)

{
  ElementsDecodeRawTransactionResponse response;
  ElementsDecodeRawTransactionRequest req;
  ElementsDecodeRawTransactionResponse *local_208;
  ElementsDecodeRawTransactionRequest *local_200 [4];
  ElementsDecodeRawTransactionResponse local_1e0;
  ElementsDecodeRawTransactionRequest local_c0;
  
  ElementsDecodeRawTransactionRequest::ElementsDecodeRawTransactionRequest(&local_c0);
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest>::Deserialize
            (&local_c0.super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest>,
             (string *)this);
  ElementsDecodeRawTransactionResponse::ElementsDecodeRawTransactionResponse(&local_1e0);
  local_208 = &local_1e0;
  local_200[0] = &local_c0;
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(request_message,local_200,&local_208);
    core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse>::Serialize_abi_cxx11_
              (__return_storage_ptr__,
               &local_1e0.super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse>)
    ;
    ElementsDecodeRawTransactionResponse::~ElementsDecodeRawTransactionResponse(&local_1e0);
    ElementsDecodeRawTransactionRequest::~ElementsDecodeRawTransactionRequest(&local_c0);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}